

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall Assimp::PretransformVertices::Execute(PretransformVertices *this,aiScene *pScene)

{
  char *pcVar1;
  size_t *psVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  aiMesh *paVar7;
  aiBone *paVar8;
  _List_node_base *p_Var9;
  aiAnimation *this_00;
  aiCamera *paVar10;
  aiLight *paVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  pointer __src;
  bool bVar16;
  Logger *pLVar17;
  aiMesh **__dest;
  uint auVar18 [2];
  ulong *puVar19;
  ulong uVar20;
  aiVector3D *paVar21;
  aiColor4D *__s;
  aiNode *paVar22;
  aiNode *paVar23;
  aiNode **ppaVar24;
  uint *puVar25;
  runtime_error *this_01;
  aiFace *paVar26;
  ulong uVar27;
  _List_node_base *p_Var28;
  uint uVar29;
  PretransformVertices *pPVar30;
  PretransformVertices *pPVar31;
  ulong uVar32;
  aiScene *pcScene;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  size_t __n;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  uint local_23c;
  aiScene *local_238;
  aiMesh **local_230;
  uint iVertices;
  list<unsigned_int,_std::allocator<unsigned_int>_> aiVFormats;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcOutMeshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s;
  uint aiTemp [2];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  pLVar17 = DefaultLogger::get();
  Logger::debug(pLVar17,"PretransformVerticesProcess begin");
  if (pScene->mNumMeshes != 0) {
    paVar22 = pScene->mRootNode;
    CountNodes(this,paVar22);
    if (this->configTransform == true) {
      fVar12 = (this->configTransformation).a1;
      fVar13 = (this->configTransformation).a2;
      fVar14 = (this->configTransformation).a3;
      fVar15 = (this->configTransformation).a4;
      fVar3 = (this->configTransformation).b1;
      fVar4 = (this->configTransformation).b2;
      fVar5 = (this->configTransformation).b3;
      fVar6 = (this->configTransformation).b4;
      fVar42 = (this->configTransformation).c1;
      fVar36 = (this->configTransformation).c2;
      fVar37 = (this->configTransformation).c3;
      fVar39 = (this->configTransformation).c4;
      fVar38 = (this->configTransformation).d2;
      fVar40 = (this->configTransformation).d3;
      fVar41 = (this->configTransformation).d4;
      (paVar22->mTransformation).d1 = (this->configTransformation).d1;
      (paVar22->mTransformation).d2 = fVar38;
      (paVar22->mTransformation).d3 = fVar40;
      (paVar22->mTransformation).d4 = fVar41;
      (paVar22->mTransformation).c1 = fVar42;
      (paVar22->mTransformation).c2 = fVar36;
      (paVar22->mTransformation).c3 = fVar37;
      (paVar22->mTransformation).c4 = fVar39;
      (paVar22->mTransformation).b1 = fVar3;
      (paVar22->mTransformation).b2 = fVar4;
      (paVar22->mTransformation).b3 = fVar5;
      (paVar22->mTransformation).b4 = fVar6;
      (paVar22->mTransformation).a1 = fVar12;
      (paVar22->mTransformation).a2 = fVar13;
      (paVar22->mTransformation).a3 = fVar14;
      (paVar22->mTransformation).a4 = fVar15;
    }
    ComputeAbsoluteTransform(this,pScene->mRootNode);
    uVar29 = pScene->mNumMeshes;
    local_238 = pScene;
    if (uVar29 != 0) {
      uVar35 = 0;
      do {
        paVar7 = local_238->mMeshes[uVar35];
        if (paVar7->mNumBones != 0) {
          uVar32 = 0;
          do {
            paVar8 = paVar7->mBones[uVar32];
            if (paVar8 != (aiBone *)0x0) {
              if (paVar8->mWeights != (aiVertexWeight *)0x0) {
                operator_delete__(paVar8->mWeights);
              }
              operator_delete(paVar8,0x450);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < paVar7->mNumBones);
        }
        if (paVar7->mBones != (aiBone **)0x0) {
          operator_delete__(paVar7->mBones);
        }
        paVar7->mBones = (aiBone **)0x0;
        uVar35 = uVar35 + 1;
        uVar29 = local_238->mNumMeshes;
      } while (uVar35 < uVar29);
    }
    pcScene = local_238;
    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (this->configKeepHierarchy == false) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                (&apcOutMeshes,(ulong)(local_238->mNumMaterials * 2));
      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      _M_size = 0;
      aiTemp = (uint  [2])((ulong)aiTemp & 0xffffffff00000000);
      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&s,(ulong)pcScene->mNumMeshes,aiTemp,(allocator_type *)&iVertices);
      BuildMeshRefCountArray
                (this,pcScene->mRootNode,
                 s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (pcScene->mNumMaterials != 0) {
        local_230 = (aiMesh **)((ulong)local_230 & 0xffffffff00000000);
        do {
          pPVar30 = (PretransformVertices *)
                    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    ._M_node.super__List_node_base._M_next;
          while (pPVar30 != (PretransformVertices *)&aiVFormats) {
            pPVar31 = (PretransformVertices *)(pPVar30->super_BaseProcess)._vptr_BaseProcess;
            operator_delete(pPVar30,0x18);
            pPVar30 = pPVar31;
          }
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          _M_size = 0;
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_prev = (_List_node_base *)&aiVFormats;
          GetVFormatList(pPVar30,pcScene,(uint)local_230,&aiVFormats);
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::sort(&aiVFormats);
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::unique(&aiVFormats);
          p_Var28 = aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    ._M_node.super__List_node_base._M_next;
          if ((PretransformVertices *)
              aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              _M_node.super__List_node_base._M_next != (PretransformVertices *)&aiVFormats) {
            do {
              iVertices = 0;
              local_23c = 0;
              CountVerticesAndFaces
                        (this,pcScene,pcScene->mRootNode,(uint)local_230,
                         *(uint *)&p_Var28[1]._M_next,&local_23c,&iVertices);
              uVar34 = iVertices;
              uVar29 = local_23c;
              uVar35 = (ulong)local_23c;
              if (iVertices != 0 && uVar35 != 0) {
                auVar18 = (uint  [2])operator_new(0x520);
                *(undefined8 *)auVar18 = 0;
                *(undefined4 *)((long)auVar18 + 8) = 0;
                memset((undefined8 *)((long)auVar18 + 0x10),0,0xcc);
                *(undefined8 *)((long)auVar18 + 0xe0) = 0;
                *(undefined8 *)((long)auVar18 + 0xe8) = 0;
                *(undefined1 *)((long)auVar18 + 0xf0) = 0;
                memset((void *)((long)auVar18 + 0xf1),0x1b,0x3ff);
                *(undefined4 *)((long)auVar18 + 0x4f0) = 0;
                *(undefined8 *)((long)auVar18 + 0x4f8) = 0;
                *(undefined8 *)((long)auVar18 + 0x500) = 0;
                *(undefined8 *)((long)auVar18 + 0x508) = 0;
                *(undefined8 *)((long)auVar18 + 0x510) = 0;
                *(undefined4 *)((long)auVar18 + 0x518) = 0;
                *(undefined8 *)((long)auVar18 + 0x70) = 0;
                *(undefined8 *)((long)auVar18 + 0x78) = 0;
                *(undefined8 *)((long)auVar18 + 0x80) = 0;
                *(undefined8 *)((long)auVar18 + 0x88) = 0;
                *(undefined8 *)((long)auVar18 + 0x90) = 0;
                *(undefined8 *)((long)auVar18 + 0x98) = 0;
                *(undefined8 *)((long)auVar18 + 0xa0) = 0;
                *(undefined8 *)((long)auVar18 + 0xa8) = 0;
                *(undefined8 *)((long)auVar18 + 0xb0) = 0;
                *(undefined8 *)((long)auVar18 + 0xb8) = 0;
                *(undefined8 *)((long)auVar18 + 0xc0) = 0;
                *(undefined8 *)((long)auVar18 + 200) = 0;
                *(undefined8 *)((long)auVar18 + 0x30) = 0;
                *(undefined8 *)((long)auVar18 + 0x38) = 0;
                *(undefined8 *)((long)auVar18 + 0x40) = 0;
                *(undefined8 *)((long)auVar18 + 0x48) = 0;
                *(undefined8 *)((long)auVar18 + 0x50) = 0;
                *(undefined8 *)((long)auVar18 + 0x58) = 0;
                *(undefined8 *)((long)auVar18 + 0x60) = 0;
                *(undefined8 *)((long)auVar18 + 0x68) = 0;
                aiTemp = auVar18;
                std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&apcOutMeshes,
                           (aiMesh **)aiTemp);
                paVar7 = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1];
                paVar7->mNumFaces = uVar29;
                paVar7->mNumVertices = uVar34;
                puVar19 = (ulong *)operator_new__(uVar35 * 0x10 + 8);
                *puVar19 = uVar35;
                paVar26 = (aiFace *)(puVar19 + 1);
                do {
                  paVar26->mNumIndices = 0;
                  paVar26->mIndices = (uint *)0x0;
                  paVar26 = paVar26 + 1;
                } while (paVar26 != (aiFace *)(puVar19 + uVar35 * 2 + 1));
                paVar7->mFaces = (aiFace *)(puVar19 + 1);
                uVar20 = (ulong)uVar34;
                uVar32 = uVar20 * 0xc;
                paVar21 = (aiVector3D *)operator_new__(uVar32);
                uVar35 = uVar20 * 0xc - 0xc;
                memset(paVar21,0,(uVar35 / 0xc) * 0xc + 0xc);
                paVar7->mVertices = paVar21;
                paVar7->mMaterialIndex = (uint)local_230;
                if (((ulong)p_Var28[1]._M_next & 2) != 0) {
                  paVar21 = (aiVector3D *)operator_new__(uVar32);
                  memset(paVar21,0,(uVar35 / 0xc) * 0xc + 0xc);
                  paVar7->mNormals = paVar21;
                }
                if (((ulong)p_Var28[1]._M_next & 4) != 0) {
                  paVar21 = (aiVector3D *)operator_new__(uVar32);
                  memset(paVar21,0,(uVar35 / 0xc) * 0xc + 0xc);
                  paVar7->mTangents = paVar21;
                  paVar21 = (aiVector3D *)operator_new__(uVar32);
                  memset(paVar21,0,(uVar35 / 0xc) * 0xc + 0xc);
                  paVar7->mBitangents = paVar21;
                }
                if (((ulong)p_Var28[1]._M_next & 0x100) != 0) {
                  uVar27 = 0;
                  do {
                    paVar21 = (aiVector3D *)operator_new__(uVar32);
                    memset(paVar21,0,(uVar35 / 0xc) * 0xc + 0xc);
                    paVar7->mTextureCoords[uVar27] = paVar21;
                    paVar7->mNumUVComponents[uVar27] =
                         (((*(uint *)&p_Var28[1]._M_next >> ((byte)uVar27 & 0x1f)) >> 0x10 & 1) != 0
                         ) + 2;
                    uVar29 = (int)uVar27 + 1;
                    uVar27 = (ulong)uVar29;
                  } while (((*(uint *)&p_Var28[1]._M_next >> ((byte)uVar29 & 0x1f)) >> 8 & 1) != 0);
                }
                local_23c = 0;
                uVar29 = *(uint *)&p_Var28[1]._M_next;
                uVar34 = 0;
                if ((uVar29 >> 0x18 & 1) != 0) {
                  uVar35 = 0;
                  do {
                    __s = (aiColor4D *)operator_new__(uVar20 << 4);
                    memset(__s,0,uVar20 << 4);
                    uVar34 = (int)uVar35 + 1;
                    paVar7->mColors[uVar35] = __s;
                    uVar29 = *(uint *)&p_Var28[1]._M_next;
                    uVar35 = (ulong)uVar34;
                  } while (((uVar29 >> ((byte)uVar34 & 0x1f)) >> 0x18 & 1) != 0);
                }
                local_23c = uVar34;
                aiTemp[0] = 0;
                aiTemp[1] = 0;
                CollectData(this,local_238,local_238->mRootNode,(uint)local_230,uVar29,paVar7,aiTemp
                            ,s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start);
                pcScene = local_238;
              }
              p_Var28 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &p_Var28->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (p_Var28 != (_List_node_base *)&aiVFormats);
          }
          uVar29 = (uint)local_230 + 1;
          local_230 = (aiMesh **)CONCAT44(local_230._4_4_,uVar29);
        } while (uVar29 < pcScene->mNumMaterials);
      }
      if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        aiTemp = (uint  [2])local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)aiTemp,
                   "No output meshes: all meshes are orphaned and are not referenced by any nodes",
                   "");
        std::runtime_error::runtime_error(this_01,(string *)aiTemp);
        *(undefined ***)this_01 = &PTR__runtime_error_007fa260;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pcScene->mNumMeshes != 0) {
        uVar35 = 0;
        do {
          paVar7 = pcScene->mMeshes[uVar35];
          paVar7->mNumBones = 0;
          paVar7->mBones = (aiBone **)0x0;
          if (paVar7->mNumFaces != 0) {
            lVar33 = 0;
            uVar32 = 0;
            do {
              *(undefined4 *)((long)&paVar7->mFaces->mNumIndices + lVar33) = 0;
              *(undefined8 *)((long)&paVar7->mFaces->mIndices + lVar33) = 0;
              uVar32 = uVar32 + 1;
              lVar33 = lVar33 + 0x10;
            } while (uVar32 < paVar7->mNumFaces);
          }
          if (paVar7 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(paVar7);
            operator_delete(paVar7,0x520);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < pcScene->mNumMeshes);
      }
      uVar29 = (uint)((ulong)((long)apcOutMeshes.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)apcOutMeshes.
                                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
      pcScene->mNumMeshes = uVar29;
      if (uVar29 != 0) {
        uVar35 = 0;
        do {
          pcScene->mMeshes[uVar35] =
               apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          uVar35 = uVar35 + 1;
        } while (uVar35 < pcScene->mNumMeshes);
      }
      if (s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var28 = aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      while (p_Var28 != (_List_node_base *)&aiVFormats) {
        p_Var9 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var28->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var28,0x18);
        p_Var28 = p_Var9;
      }
    }
    else {
      pPVar30 = this;
      BuildWCSMeshes(this,&apcOutMeshes,local_238->mMeshes,uVar29,local_238->mRootNode);
      __src = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      __n = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (__n != 0) {
        lVar33 = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        uVar29 = pcScene->mNumMeshes;
        uVar32 = (ulong)uVar29;
        uVar35 = lVar33 + uVar32;
        __dest = (aiMesh **)operator_new__(-(ulong)(uVar35 >> 0x3d != 0) | uVar35 * 8);
        pPVar31 = (PretransformVertices *)pcScene->mMeshes;
        memcpy(__dest,pPVar31,uVar32 * 8);
        pPVar30 = (PretransformVertices *)(__dest + uVar32);
        local_230 = __dest;
        memcpy(pPVar30,__src,__n);
        local_238->mNumMeshes = (int)lVar33 + uVar29;
        if (pPVar31 != (PretransformVertices *)0x0) {
          operator_delete__(pPVar31);
          pPVar30 = pPVar31;
        }
        local_238->mMeshes = local_230;
        pcScene = local_238;
      }
      if (pcScene->mNumMeshes != 0) {
        uVar35 = 0;
        do {
          ApplyTransform(pPVar30,pcScene->mMeshes[uVar35],
                         (aiMatrix4x4 *)pcScene->mMeshes[uVar35]->mBones);
          pcScene->mMeshes[uVar35]->mBones = (aiBone **)0x0;
          pcScene->mMeshes[uVar35]->mNumBones = 0;
          uVar35 = uVar35 + 1;
        } while (uVar35 < pcScene->mNumMeshes);
      }
    }
    if (pcScene->mNumAnimations != 0) {
      uVar35 = 0;
      do {
        this_00 = pcScene->mAnimations[uVar35];
        if (this_00 != (aiAnimation *)0x0) {
          aiAnimation::~aiAnimation(this_00);
          operator_delete(this_00,0x448);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 < pcScene->mNumAnimations);
    }
    if (pcScene->mAnimations != (aiAnimation **)0x0) {
      operator_delete__(pcScene->mAnimations);
    }
    pcScene->mAnimations = (aiAnimation **)0x0;
    pcScene->mNumAnimations = 0;
    if (pcScene->mNumCameras != 0) {
      uVar35 = 0;
      do {
        paVar10 = pcScene->mCameras[uVar35];
        paVar22 = aiNode::FindNode(pcScene->mRootNode,(paVar10->mName).data);
        if (paVar22 == (aiNode *)0x0) {
          __assert_fail("__null != nd",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/PretransformVertices.cpp"
                        ,0x265,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
        }
        fVar38 = (paVar10->mPosition).x;
        fVar40 = (paVar10->mPosition).y;
        fVar41 = (paVar10->mPosition).z;
        fVar42 = (paVar22->mTransformation).b2;
        fVar36 = (paVar22->mTransformation).b1;
        fVar37 = (paVar22->mTransformation).b3;
        fVar39 = (paVar22->mTransformation).b4;
        fVar3 = (paVar22->mTransformation).c2;
        fVar4 = (paVar22->mTransformation).c1;
        fVar5 = (paVar22->mTransformation).c3;
        fVar6 = (paVar22->mTransformation).c4;
        (paVar10->mPosition).x =
             (paVar22->mTransformation).a3 * fVar41 +
             (paVar22->mTransformation).a1 * fVar38 + (paVar22->mTransformation).a2 * fVar40 +
             (paVar22->mTransformation).a4;
        (paVar10->mPosition).y = fVar37 * fVar41 + fVar36 * fVar38 + fVar42 * fVar40 + fVar39;
        (paVar10->mPosition).z = fVar41 * fVar5 + fVar38 * fVar4 + fVar40 * fVar3 + fVar6;
        fVar38 = (paVar10->mLookAt).x;
        fVar40 = (paVar10->mLookAt).y;
        fVar41 = (paVar10->mLookAt).z;
        fVar42 = (paVar22->mTransformation).b2;
        fVar36 = (paVar22->mTransformation).b1;
        fVar37 = (paVar22->mTransformation).b3;
        fVar39 = (paVar22->mTransformation).c2;
        fVar3 = (paVar22->mTransformation).c1;
        fVar4 = (paVar22->mTransformation).c3;
        (paVar10->mLookAt).x =
             (paVar22->mTransformation).a3 * fVar41 +
             (paVar22->mTransformation).a1 * fVar38 + (paVar22->mTransformation).a2 * fVar40;
        (paVar10->mLookAt).y = fVar37 * fVar41 + fVar36 * fVar38 + fVar42 * fVar40;
        (paVar10->mLookAt).z = fVar41 * fVar4 + fVar38 * fVar3 + fVar40 * fVar39;
        fVar38 = (paVar10->mUp).x;
        fVar40 = (paVar10->mUp).y;
        fVar41 = (paVar10->mUp).z;
        fVar42 = (paVar22->mTransformation).b2;
        fVar36 = (paVar22->mTransformation).b1;
        fVar37 = (paVar22->mTransformation).b3;
        fVar39 = (paVar22->mTransformation).c2;
        fVar3 = (paVar22->mTransformation).c1;
        fVar4 = (paVar22->mTransformation).c3;
        (paVar10->mUp).x =
             (paVar22->mTransformation).a3 * fVar41 +
             (paVar22->mTransformation).a1 * fVar38 + (paVar22->mTransformation).a2 * fVar40;
        (paVar10->mUp).y = fVar37 * fVar41 + fVar36 * fVar38 + fVar42 * fVar40;
        (paVar10->mUp).z = fVar41 * fVar4 + fVar38 * fVar3 + fVar40 * fVar39;
        uVar35 = uVar35 + 1;
      } while (uVar35 < pcScene->mNumCameras);
    }
    if (pcScene->mNumLights != 0) {
      uVar35 = 0;
      do {
        paVar11 = pcScene->mLights[uVar35];
        paVar22 = aiNode::FindNode(pcScene->mRootNode,(paVar11->mName).data);
        if (paVar22 == (aiNode *)0x0) {
          __assert_fail("__null != nd",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/PretransformVertices.cpp"
                        ,0x272,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
        }
        fVar38 = (paVar11->mPosition).x;
        fVar40 = (paVar11->mPosition).y;
        fVar41 = (paVar11->mPosition).z;
        fVar42 = (paVar22->mTransformation).b2;
        fVar36 = (paVar22->mTransformation).b1;
        fVar37 = (paVar22->mTransformation).b3;
        fVar39 = (paVar22->mTransformation).b4;
        fVar3 = (paVar22->mTransformation).c2;
        fVar4 = (paVar22->mTransformation).c1;
        fVar5 = (paVar22->mTransformation).c3;
        fVar6 = (paVar22->mTransformation).c4;
        (paVar11->mPosition).x =
             (paVar22->mTransformation).a3 * fVar41 +
             (paVar22->mTransformation).a1 * fVar38 + (paVar22->mTransformation).a2 * fVar40 +
             (paVar22->mTransformation).a4;
        (paVar11->mPosition).y = fVar37 * fVar41 + fVar36 * fVar38 + fVar42 * fVar40 + fVar39;
        (paVar11->mPosition).z = fVar41 * fVar5 + fVar38 * fVar4 + fVar40 * fVar3 + fVar6;
        fVar38 = (paVar11->mDirection).x;
        fVar40 = (paVar11->mDirection).y;
        fVar41 = (paVar11->mDirection).z;
        fVar42 = (paVar22->mTransformation).b2;
        fVar36 = (paVar22->mTransformation).b1;
        fVar37 = (paVar22->mTransformation).b3;
        fVar39 = (paVar22->mTransformation).c2;
        fVar3 = (paVar22->mTransformation).c1;
        fVar4 = (paVar22->mTransformation).c3;
        (paVar11->mDirection).x =
             (paVar22->mTransformation).a3 * fVar41 +
             (paVar22->mTransformation).a1 * fVar38 + (paVar22->mTransformation).a2 * fVar40;
        (paVar11->mDirection).y = fVar37 * fVar41 + fVar36 * fVar38 + fVar42 * fVar40;
        (paVar11->mDirection).z = fVar41 * fVar4 + fVar38 * fVar3 + fVar40 * fVar39;
        fVar38 = (paVar11->mUp).x;
        fVar40 = (paVar11->mUp).y;
        fVar41 = (paVar11->mUp).z;
        fVar42 = (paVar22->mTransformation).b2;
        fVar36 = (paVar22->mTransformation).b1;
        fVar37 = (paVar22->mTransformation).b3;
        fVar39 = (paVar22->mTransformation).c2;
        fVar3 = (paVar22->mTransformation).c1;
        fVar4 = (paVar22->mTransformation).c3;
        (paVar11->mUp).x =
             (paVar22->mTransformation).a3 * fVar41 +
             (paVar22->mTransformation).a1 * fVar38 + (paVar22->mTransformation).a2 * fVar40;
        (paVar11->mUp).y = fVar37 * fVar41 + fVar36 * fVar38 + fVar42 * fVar40;
        (paVar11->mUp).z = fVar41 * fVar4 + fVar38 * fVar3 + fVar40 * fVar39;
        uVar35 = uVar35 + 1;
      } while (uVar35 < pcScene->mNumLights);
    }
    if (this->configKeepHierarchy == false) {
      paVar23 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar23);
      paVar22 = pcScene->mRootNode;
      if (paVar23 != paVar22) {
        uVar29 = (paVar22->mName).length;
        (paVar23->mName).length = uVar29;
        memcpy((paVar23->mName).data,(paVar22->mName).data,(ulong)uVar29);
        (paVar23->mName).data[uVar29] = '\0';
      }
      if (paVar22 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar22);
        operator_delete(paVar22,0x478);
      }
      pcScene->mRootNode = paVar23;
      if (((pcScene->mNumMeshes == 1) && (pcScene->mNumLights == 0)) && (pcScene->mNumCameras == 0))
      {
        paVar23->mNumMeshes = 1;
        puVar25 = (uint *)operator_new__(4);
        paVar23->mMeshes = puVar25;
        *puVar25 = 0;
      }
      else {
        uVar29 = pcScene->mNumMeshes + pcScene->mNumLights + pcScene->mNumCameras;
        paVar23->mNumChildren = uVar29;
        ppaVar24 = (aiNode **)operator_new__((ulong)uVar29 << 3);
        paVar23->mChildren = ppaVar24;
        if (pcScene->mNumMeshes != 0) {
          lVar33 = 0;
          uVar35 = 0;
          do {
            paVar22 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar22);
            ppaVar24[uVar35] = paVar22;
            paVar22->mParent = local_238->mRootNode;
            paVar7 = local_238->mMeshes[uVar35];
            if (paVar22 != (aiNode *)&paVar7->mName) {
              uVar29 = (paVar7->mName).length;
              (paVar22->mName).length = uVar29;
              memcpy((paVar22->mName).data,(paVar7->mName).data,(ulong)uVar29);
              (paVar22->mName).data[uVar29] = '\0';
            }
            paVar22->mNumMeshes = 1;
            puVar25 = (uint *)operator_new__(4);
            paVar22->mMeshes = puVar25;
            *puVar25 = (uint)uVar35;
            uVar35 = uVar35 + 1;
            lVar33 = lVar33 + 8;
          } while (uVar35 < local_238->mNumMeshes);
          ppaVar24 = (aiNode **)((long)ppaVar24 + lVar33);
          pcScene = local_238;
        }
        if (pcScene->mNumLights != 0) {
          lVar33 = 0;
          uVar35 = 0;
          do {
            paVar23 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar23);
            ppaVar24[uVar35] = paVar23;
            paVar23->mParent = pcScene->mRootNode;
            pcVar1 = (paVar23->mName).data;
            uVar29 = snprintf(pcVar1,0x400,"light_%u",uVar35 & 0xffffffff);
            (paVar23->mName).length = uVar29;
            paVar22 = (aiNode *)pcScene->mLights[uVar35];
            if (paVar22 != paVar23) {
              (paVar22->mName).length = uVar29;
              memcpy((paVar22->mName).data,pcVar1,(ulong)uVar29);
              (paVar22->mName).data[uVar29] = '\0';
            }
            uVar35 = uVar35 + 1;
            lVar33 = lVar33 + 8;
            pcScene = local_238;
          } while (uVar35 < local_238->mNumLights);
          ppaVar24 = (aiNode **)((long)ppaVar24 + lVar33);
        }
        if (pcScene->mNumCameras != 0) {
          uVar35 = 0;
          do {
            paVar23 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar23);
            ppaVar24[uVar35] = paVar23;
            paVar23->mParent = pcScene->mRootNode;
            pcVar1 = (paVar23->mName).data;
            uVar29 = snprintf(pcVar1,0x400,"cam_%u",uVar35 & 0xffffffff);
            (paVar23->mName).length = uVar29;
            paVar22 = (aiNode *)pcScene->mCameras[uVar35];
            if (paVar22 != paVar23) {
              (paVar22->mName).length = uVar29;
              memcpy((paVar22->mName).data,pcVar1,(ulong)uVar29);
              (paVar22->mName).data[uVar29] = '\0';
            }
            uVar35 = uVar35 + 1;
            pcScene = local_238;
          } while (uVar35 < local_238->mNumCameras);
        }
      }
    }
    else {
      MakeIdentityTransform(this,pcScene->mRootNode);
    }
    if (this->configNormalize == true) {
      if ((ulong)pcScene->mNumMeshes == 0) {
        fVar37 = 1e+10;
        fVar41 = 1e+10;
        fVar42 = 1e+10;
        fVar36 = -1e+10;
        fVar38 = -1e+10;
        fVar40 = -1e+10;
      }
      else {
        fVar38 = -1e+10;
        fVar40 = -1e+10;
        fVar36 = -1e+10;
        fVar41 = 1e+10;
        fVar42 = 1e+10;
        fVar37 = 1e+10;
        uVar35 = 0;
        do {
          uVar32 = (ulong)pcScene->mMeshes[uVar35]->mNumVertices;
          if (uVar32 != 0) {
            paVar21 = pcScene->mMeshes[uVar35]->mVertices;
            lVar33 = 0;
            do {
              fVar39 = *(float *)((long)&paVar21->x + lVar33);
              fVar3 = *(float *)((long)&paVar21->y + lVar33);
              if (fVar39 <= fVar41) {
                fVar41 = fVar39;
              }
              if (fVar3 <= fVar42) {
                fVar42 = fVar3;
              }
              fVar4 = *(float *)((long)&paVar21->z + lVar33);
              if (fVar4 <= fVar37) {
                fVar37 = fVar4;
              }
              if (fVar38 <= fVar39) {
                fVar38 = fVar39;
              }
              if (fVar40 <= fVar3) {
                fVar40 = fVar3;
              }
              if (fVar36 <= fVar4) {
                fVar36 = fVar4;
              }
              lVar33 = lVar33 + 0xc;
            } while (uVar32 * 0xc != lVar33);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != pcScene->mNumMeshes);
      }
      if (pcScene->mNumMeshes != 0) {
        fVar36 = fVar36 - fVar37;
        fVar38 = fVar38 - fVar41;
        fVar40 = fVar40 - fVar42;
        fVar39 = fVar36;
        if (fVar36 <= fVar40) {
          fVar39 = fVar40;
        }
        if (fVar39 <= fVar38) {
          fVar39 = fVar38;
        }
        fVar39 = 1.0 / (fVar39 * 0.5);
        uVar35 = 0;
        do {
          paVar7 = pcScene->mMeshes[uVar35];
          if (paVar7->mNumVertices != 0) {
            lVar33 = 8;
            uVar32 = 0;
            do {
              paVar21 = paVar7->mVertices;
              fVar3 = *(float *)((long)&paVar21->x + lVar33);
              *(ulong *)((long)paVar21 + lVar33 + -8) =
                   CONCAT44((*(float *)((long)paVar21 + lVar33 + -4) - (fVar40 * 0.5 + fVar42)) *
                            fVar39,(*(float *)((long)paVar21 + lVar33 + -8) -
                                   (fVar38 * 0.5 + fVar41)) * fVar39);
              *(float *)((long)&paVar21->x + lVar33) = (fVar3 - (fVar36 * 0.5 + fVar37)) * fVar39;
              uVar32 = uVar32 + 1;
              lVar33 = lVar33 + 0xc;
            } while (uVar32 < paVar7->mNumVertices);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < pcScene->mNumMeshes);
      }
    }
    bVar16 = DefaultLogger::isNullLogger();
    if (!bVar16) {
      pLVar17 = DefaultLogger::get();
      Logger::debug(pLVar17,"PretransformVerticesProcess finished");
      pLVar17 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[9]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
                 (char (*) [9])0x6ad0d2);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," nodes and ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aiTemp," animation channels (",0x15);
      CountNodes(this,pcScene->mRootNode);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," output nodes)",0xe);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar17,(char *)aiVFormats.
                                   super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl._M_node.super__List_node_base._M_next);
      psVar2 = &aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node._M_size;
      if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node.super__List_node_base._M_next,
                        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node._M_size + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
      std::ios_base::~ios_base(local_138);
      pLVar17 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[6]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
                 (char (*) [6])"Kept ");
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," lights and ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," cameras.",9);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar17,(char *)aiVFormats.
                                   super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl._M_node.super__List_node_base._M_next);
      if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node.super__List_node_base._M_next,
                        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node._M_size + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
      std::ios_base::~ios_base(local_138);
      pLVar17 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
                 (char (*) [7])"Moved ");
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aiTemp," meshes to WCS (number of output meshes: ",0x29);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp,")",1);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar17,(char *)aiVFormats.
                                   super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl._M_node.super__List_node_base._M_next);
      if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node.super__List_node_base._M_next,
                        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node._M_size + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
      std::ios_base::~ios_base(local_138);
    }
    if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void PretransformVertices::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("PretransformVerticesProcess begin");

    // Return immediately if we have no meshes
    if (!pScene->mNumMeshes)
        return;

    const unsigned int iOldMeshes = pScene->mNumMeshes;
    const unsigned int iOldAnimationChannels = pScene->mNumAnimations;
    const unsigned int iOldNodes = CountNodes(pScene->mRootNode);

    if(configTransform) {
        pScene->mRootNode->mTransformation = configTransformation;
    }

    // first compute absolute transformation matrices for all nodes
    ComputeAbsoluteTransform(pScene->mRootNode);

    // Delete aiMesh::mBones for all meshes. The bones are
    // removed during this step and we need the pointer as
    // temporary storage
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        aiMesh* mesh = pScene->mMeshes[i];

        for (unsigned int a = 0; a < mesh->mNumBones;++a)
            delete mesh->mBones[a];

        delete[] mesh->mBones;
        mesh->mBones = NULL;
    }

    // now build a list of output meshes
    std::vector<aiMesh*> apcOutMeshes;

    // Keep scene hierarchy? It's an easy job in this case ...
    // we go on and transform all meshes, if one is referenced by nodes
    // with different absolute transformations a depth copy of the mesh
    // is required.
    if( configKeepHierarchy ) {

        // Hack: store the matrix we're transforming a mesh with in aiMesh::mBones
        BuildWCSMeshes(apcOutMeshes,pScene->mMeshes,pScene->mNumMeshes, pScene->mRootNode);

        // ... if new meshes have been generated, append them to the end of the scene
        if (apcOutMeshes.size() > 0) {
            aiMesh** npp = new aiMesh*[pScene->mNumMeshes + apcOutMeshes.size()];

            memcpy(npp,pScene->mMeshes,sizeof(aiMesh*)*pScene->mNumMeshes);
            memcpy(npp+pScene->mNumMeshes,&apcOutMeshes[0],sizeof(aiMesh*)*apcOutMeshes.size());

            pScene->mNumMeshes  += static_cast<unsigned int>(apcOutMeshes.size());
            delete[] pScene->mMeshes; pScene->mMeshes = npp;
        }

        // now iterate through all meshes and transform them to worldspace
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            ApplyTransform(pScene->mMeshes[i],*reinterpret_cast<aiMatrix4x4*>( pScene->mMeshes[i]->mBones ));

            // prevent improper destruction
            pScene->mMeshes[i]->mBones    = NULL;
            pScene->mMeshes[i]->mNumBones = 0;
        }
    } else {
        apcOutMeshes.reserve(pScene->mNumMaterials<<1u);
        std::list<unsigned int> aiVFormats;

        std::vector<unsigned int> s(pScene->mNumMeshes,0);
        BuildMeshRefCountArray(pScene->mRootNode,&s[0]);

        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)     {
            // get the list of all vertex formats for this material
            aiVFormats.clear();
            GetVFormatList(pScene,i,aiVFormats);
            aiVFormats.sort();
            aiVFormats.unique();
            for (std::list<unsigned int>::const_iterator j =  aiVFormats.begin();j != aiVFormats.end();++j) {
                unsigned int iVertices = 0;
                unsigned int iFaces = 0;
                CountVerticesAndFaces(pScene,pScene->mRootNode,i,*j,&iFaces,&iVertices);
                if (0 != iFaces && 0 != iVertices)
                {
                    apcOutMeshes.push_back(new aiMesh());
                    aiMesh* pcMesh = apcOutMeshes.back();
                    pcMesh->mNumFaces = iFaces;
                    pcMesh->mNumVertices = iVertices;
                    pcMesh->mFaces = new aiFace[iFaces];
                    pcMesh->mVertices = new aiVector3D[iVertices];
                    pcMesh->mMaterialIndex = i;
                    if ((*j) & 0x2)pcMesh->mNormals = new aiVector3D[iVertices];
                    if ((*j) & 0x4)
                    {
                        pcMesh->mTangents    = new aiVector3D[iVertices];
                        pcMesh->mBitangents  = new aiVector3D[iVertices];
                    }
                    iFaces = 0;
                    while ((*j) & (0x100 << iFaces))
                    {
                        pcMesh->mTextureCoords[iFaces] = new aiVector3D[iVertices];
                        if ((*j) & (0x10000 << iFaces))pcMesh->mNumUVComponents[iFaces] = 3;
                        else pcMesh->mNumUVComponents[iFaces] = 2;
                        iFaces++;
                    }
                    iFaces = 0;
                    while ((*j) & (0x1000000 << iFaces))
                        pcMesh->mColors[iFaces++] = new aiColor4D[iVertices];

                    // fill the mesh ...
                    unsigned int aiTemp[2] = {0,0};
                    CollectData(pScene,pScene->mRootNode,i,*j,pcMesh,aiTemp,&s[0]);
                }
            }
        }

        // If no meshes are referenced in the node graph it is possible that we get no output meshes.
        if (apcOutMeshes.empty()) {
            
            throw DeadlyImportError("No output meshes: all meshes are orphaned and are not referenced by any nodes");
        }
        else
        {
            // now delete all meshes in the scene and build a new mesh list
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
            {
                aiMesh* mesh = pScene->mMeshes[i];
                mesh->mNumBones = 0;
                mesh->mBones    = NULL;

                // we're reusing the face index arrays. avoid destruction
                for (unsigned int a = 0; a < mesh->mNumFaces; ++a) {
                    mesh->mFaces[a].mNumIndices = 0;
                    mesh->mFaces[a].mIndices = NULL;
                }

                delete mesh;

                // Invalidate the contents of the old mesh array. We will most
                // likely have less output meshes now, so the last entries of
                // the mesh array are not overridden. We set them to NULL to
                // make sure the developer gets notified when his application
                // attempts to access these fields ...
                mesh = NULL;
            }

            // It is impossible that we have more output meshes than
            // input meshes, so we can easily reuse the old mesh array
            pScene->mNumMeshes = (unsigned int)apcOutMeshes.size();
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
                pScene->mMeshes[i] = apcOutMeshes[i];
            }
        }
    }

    // remove all animations from the scene
    for (unsigned int i = 0; i < pScene->mNumAnimations;++i)
        delete pScene->mAnimations[i];
    delete[] pScene->mAnimations;

    pScene->mAnimations    = NULL;
    pScene->mNumAnimations = 0;

    // --- we need to keep all cameras and lights
    for (unsigned int i = 0; i < pScene->mNumCameras;++i)
    {
        aiCamera* cam = pScene->mCameras[i];
        const aiNode* nd = pScene->mRootNode->FindNode(cam->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        cam->mPosition = nd->mTransformation * cam->mPosition;
        cam->mLookAt   = aiMatrix3x3( nd->mTransformation ) * cam->mLookAt;
        cam->mUp       = aiMatrix3x3( nd->mTransformation ) * cam->mUp;
    }

    for (unsigned int i = 0; i < pScene->mNumLights;++i)
    {
        aiLight* l = pScene->mLights[i];
        const aiNode* nd = pScene->mRootNode->FindNode(l->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        l->mPosition   = nd->mTransformation * l->mPosition;
        l->mDirection  = aiMatrix3x3( nd->mTransformation ) * l->mDirection;
        l->mUp         = aiMatrix3x3( nd->mTransformation ) * l->mUp;
    }

    if( !configKeepHierarchy ) {

        // now delete all nodes in the scene and build a new
        // flat node graph with a root node and some level 1 children
        aiNode* newRoot = new aiNode();
        newRoot->mName = pScene->mRootNode->mName;
        delete pScene->mRootNode;
        pScene->mRootNode = newRoot;

        if (1 == pScene->mNumMeshes && !pScene->mNumLights && !pScene->mNumCameras)
        {
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
        else
        {
            pScene->mRootNode->mNumChildren = pScene->mNumMeshes+pScene->mNumLights+pScene->mNumCameras;
            aiNode** nodes = pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];

            // generate mesh nodes
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName = pScene->mMeshes[i]->mName;

                // setup mesh indices
                pcNode->mNumMeshes = 1;
                pcNode->mMeshes = new unsigned int[1];
                pcNode->mMeshes[0] = i;
            }
            // generate light nodes
            for (unsigned int i = 0; i < pScene->mNumLights;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "light_%u",i);
                pScene->mLights[i]->mName = pcNode->mName;
            }
            // generate camera nodes
            for (unsigned int i = 0; i < pScene->mNumCameras;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ::ai_snprintf(pcNode->mName.data,MAXLEN,"cam_%u",i);
                pScene->mCameras[i]->mName = pcNode->mName;
            }
        }
    }
    else {
        // ... and finally set the transformation matrix of all nodes to identity
        MakeIdentityTransform(pScene->mRootNode);
    }

    if (configNormalize) {
        // compute the boundary of all meshes
        aiVector3D min,max;
        MinMaxChooser<aiVector3D> ()(min,max);

        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                min = std::min(m->mVertices[i],min);
                max = std::max(m->mVertices[i],max);
            }
        }

        // find the dominant axis
        aiVector3D d = max-min;
        const ai_real div = std::max(d.x,std::max(d.y,d.z))*ai_real( 0.5);

        d = min + d * (ai_real)0.5;
        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                m->mVertices[i] = (m->mVertices[i]-d)/div;
            }
        }
    }

    // print statistics
    if (!DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_DEBUG("PretransformVerticesProcess finished");

        ASSIMP_LOG_INFO_F("Removed ", iOldNodes, " nodes and ", iOldAnimationChannels, " animation channels (", 
            CountNodes(pScene->mRootNode) ," output nodes)" );
        ASSIMP_LOG_INFO_F("Kept ", pScene->mNumLights, " lights and ", pScene->mNumCameras, " cameras." );
        ASSIMP_LOG_INFO_F("Moved ", iOldMeshes, " meshes to WCS (number of output meshes: ", pScene->mNumMeshes, ")");
    }
}